

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,int value)

{
  size_t sVar1;
  uint uVar2;
  
  if (cctx->streamStage != zcss_init) {
    if ((5 < param - ZSTD_c_hashLog) && (param != ZSTD_c_compressionLevel)) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  sVar1 = 0xffffffffffffffd8;
  if ((int)param < 200) {
    if ((int)param < 0xa0) {
      if (6 < param - ZSTD_c_windowLog) {
        if (param != ZSTD_c_experimentalParam2) {
          if (param != ZSTD_c_compressionLevel) {
            return 0xffffffffffffffd8;
          }
          if (cctx->cdict != (ZSTD_CDict *)0x0) {
            return 0xffffffffffffffc4;
          }
          uVar2 = 0x16;
          if (((value < 0x17) && (uVar2 = 0xfffe0000, -0x20001 < value)) &&
             (uVar2 = value, value == 0)) {
            uVar2 = (cctx->requestedParams).compressionLevel;
          }
          else {
            (cctx->requestedParams).compressionLevel = uVar2;
          }
          sVar1 = 0;
          if (0 < (int)uVar2) {
            sVar1 = (size_t)uVar2;
          }
          return sVar1;
        }
        if (1 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (cctx->requestedParams).format = value;
LAB_004726a1:
        return (ulong)(uint)value;
      }
    }
    else if (4 < param - ZSTD_c_enableLongDistanceMatching) {
      return 0xffffffffffffffd8;
    }
    sVar1 = 0xffffffffffffffc4;
    if (cctx->cdict == (ZSTD_CDict *)0x0) {
LAB_0047263b:
      sVar1 = ZSTD_CCtxParam_setParameter(&cctx->requestedParams,param,value);
      return sVar1;
    }
  }
  else if ((int)param < 0x191) {
    if (param - ZSTD_c_contentSizeFlag < 3) goto LAB_0047263b;
    if (param == ZSTD_c_nbWorkers) {
      if (value == 0) {
        sVar1 = 0;
      }
      return sVar1;
    }
  }
  else if ((int)param < 1000) {
    if ((param - ZSTD_c_jobSize < 2) || (param == ZSTD_c_experimentalParam1)) goto LAB_0047263b;
  }
  else {
    if (param == ZSTD_c_experimentalParam3) {
      (cctx->requestedParams).forceWindow = (uint)(value != 0);
      return (ulong)(value != 0);
    }
    if ((param == ZSTD_c_experimentalParam4) && (sVar1 = 0xffffffffffffffd6, (uint)value < 3)) {
      (cctx->requestedParams).attachDictPref = value;
      goto LAB_004726a1;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%i, %i)", (int)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            return ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_c_format :
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_compressionLevel:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_windowLog:
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
    case ZSTD_c_searchLog:
    case ZSTD_c_minMatch:
    case ZSTD_c_targetLength:
    case ZSTD_c_strategy:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_contentSizeFlag:
    case ZSTD_c_checksumFlag:
    case ZSTD_c_dictIDFlag:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_forceMaxWindow :  /* Force back-references to remain < windowSize,
                                   * even when referencing into Dictionary content.
                                   * default : 0 when using a CDict, 1 when using a Prefix */
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_forceAttachDict:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_nbWorkers:
        if ((value!=0) && cctx->staticSize) {
            return ERROR(parameter_unsupported);  /* MT not compatible with static alloc */
        }
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_jobSize:
    case ZSTD_c_overlapLog:
    case ZSTD_c_rsyncable:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_c_enableLongDistanceMatching:
    case ZSTD_c_ldmHashLog:
    case ZSTD_c_ldmMinMatch:
    case ZSTD_c_ldmBucketSizeLog:
    case ZSTD_c_ldmHashRateLog:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    default: return ERROR(parameter_unsupported);
    }
}